

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer>::~list
          (list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer> *this)

{
  bool bVar1;
  condition_base<void_()> *t;
  iterator local_28;
  iterator p;
  iterator local_18;
  iterator i;
  list<trompeloeil::condition_base<void_()>,_trompeloeil::delete_disposer> *this_local;
  
  (this->super_list_elem<trompeloeil::condition_base<void_()>_>)._vptr_list_elem =
       (_func_int **)&PTR__list_0024ff08;
  i.p = &this->super_list_elem<trompeloeil::condition_base<void_()>_>;
  local_18 = begin(this);
  while( true ) {
    p = end(this);
    bVar1 = trompeloeil::operator!=(&local_18,&p);
    if (!bVar1) break;
    local_28 = iterator::operator++(&local_18,0);
    t = iterator::operator*(&local_28);
    delete_disposer::dispose<trompeloeil::condition_base<void()>>((delete_disposer *)this,t);
  }
  list_elem<trompeloeil::condition_base<void_()>_>::~list_elem
            (&this->super_list_elem<trompeloeil::condition_base<void_()>_>);
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto p = i++;
      Disposer::dispose(&*p);
    }
  }